

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ListeningReporter::sectionEnded(ListeningReporter *this,SectionStats *sectionStats)

{
  bool bVar1;
  reference this_00;
  pointer pIVar2;
  unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_> *listener;
  iterator __end1;
  iterator __begin1;
  Reporters *__range1;
  SectionStats *sectionStats_local;
  ListeningReporter *this_local;
  
  __end1 = clara::std::
           vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
           ::begin(&this->m_listeners);
  listener = (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
              *)clara::std::
                vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
                ::end(&this->m_listeners);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
                                *)&listener);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
              ::operator*(&__end1);
    pIVar2 = clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator->(this_00);
    (*pIVar2->_vptr_IStreamingReporter[0xb])(pIVar2,sectionStats);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_*,_std::vector<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>_>
    ::operator++(&__end1);
  }
  pIVar2 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar2->_vptr_IStreamingReporter[0xb])(pIVar2,sectionStats);
  return;
}

Assistant:

void ListeningReporter::sectionEnded( SectionStats const& sectionStats ) {
        for ( auto const& listener : m_listeners ) {
            listener->sectionEnded( sectionStats );
        }
        m_reporter->sectionEnded( sectionStats );
    }